

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.hpp
# Opt level: O1

void __thiscall Args::AllOfGroup::checkCorrectnessAfterParsing(AllOfGroup *this)

{
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *puVar1;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *puVar2;
  pointer pcVar3;
  long lVar4;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  _Var5;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  _Var6;
  logic_error *this_00;
  long *plVar7;
  ulong *puVar8;
  ulong *local_b0;
  undefined8 local_a0;
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GroupIface::checkCorrectnessAfterParsing(&this->super_GroupIface);
  puVar1 = (this->super_GroupIface).m_children.
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,__gnu_cxx::__ops::_Iter_pred<Args::AllOfGroup::checkCorrectnessAfterParsing()const::_lambda(auto:1_const&)_1_>>
                    ((this->super_GroupIface).m_children.
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,puVar1);
  puVar2 = (this->super_GroupIface).m_children.
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,__gnu_cxx::__ops::_Iter_negate<Args::AllOfGroup::checkCorrectnessAfterParsing()const::_lambda(auto:1_const&)_2_>>
                    ((this->super_GroupIface).m_children.
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,puVar2);
  if ((_Var5._M_current != puVar1) && (_Var6._M_current != puVar2)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x30);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"All arguments in AllOf group \"","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    pcVar3 = (this->super_GroupIface).m_name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + (this->super_GroupIface).m_name._M_string_length)
    ;
    std::operator+(&local_50,&local_70,&local_90);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = (ulong *)*plVar7;
    puVar8 = (ulong *)(plVar7 + 2);
    if (local_b0 == puVar8) {
      local_a0 = *puVar8;
      uStack_98 = plVar7[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *puVar8;
    }
    lVar4 = plVar7[1];
    *plVar7 = (long)puVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
    *(undefined ***)this_00 = &PTR__BaseException_00137920;
    *(logic_error **)(this_00 + 0x10) = this_00 + 0x20;
    if (local_b0 == &local_a0) {
      *(undefined4 *)(this_00 + 0x20) = (undefined4)local_a0;
      *(undefined4 *)(this_00 + 0x24) = local_a0._4_4_;
      *(undefined4 *)(this_00 + 0x28) = (undefined4)uStack_98;
      *(undefined4 *)(this_00 + 0x2c) = uStack_98._4_4_;
    }
    else {
      *(ulong **)(this_00 + 0x10) = local_b0;
      *(ulong *)(this_00 + 0x20) = local_a0;
    }
    *(long *)(this_00 + 0x18) = lVar4;
    local_a0 = local_a0 & 0xffffffffffffff00;
    __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
  }
  return;
}

Assistant:

void checkCorrectnessAfterParsing() const override
	{
		GroupIface::checkCorrectnessAfterParsing();

		const bool defined = std::any_of( children().cbegin(), children().cend(),
			[] ( const auto & arg ) { return arg->isDefined(); } );

		const bool all = std::all_of( children().cbegin(), children().cend(),
			[] ( const auto & arg ) { return arg->isDefined(); } );

		if( defined && !all )
			throw BaseException( String( SL( "All arguments in "
				"AllOf group \"" ) ) + name() + SL( "\" should be defined." ) );
	}